

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeModuleDefinitionInfo
          (cmGeneratorTarget *this,string *config,ModuleDefinitionInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer ppcVar2;
  pointer ppcVar3;
  bool bVar4;
  long *plVar5;
  size_type *psVar6;
  string obj_dir;
  string local_68;
  string local_48;
  
  GetModuleDefinitionSources(this,&info->Sources,config);
  this_00 = this->Makefile;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS","");
  bVar4 = cmMakefile::IsOn(this_00,&local_48);
  if (bVar4) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    bVar4 = cmTarget::GetPropertyAsBool(this->Target,&local_68);
    info->WindowsExportAllSymbols = bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    info->WindowsExportAllSymbols = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (info->WindowsExportAllSymbols == false) {
    ppcVar2 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar3 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar4 = (ulong)((long)ppcVar3 - (long)ppcVar2) < 9;
    info->DefFileGenerated = !bVar4;
    if (bVar4) {
      if (ppcVar2 == ppcVar3) {
        return;
      }
      cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar2);
      std::__cxx11::string::_M_assign((string *)info);
      return;
    }
  }
  else {
    info->DefFileGenerated = true;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x16])
            (&local_68,this->GlobalGenerator,&this->ObjectDirectory,config);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_48.field_2._M_allocated_capacity = *psVar6;
    local_48.field_2._8_8_ = plVar5[3];
    local_48._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar6;
    local_48._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_48._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)info,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeModuleDefinitionInfo(
  std::string const& config, ModuleDefinitionInfo& info) const
{
  this->GetModuleDefinitionSources(info.Sources, config);
  info.WindowsExportAllSymbols =
    this->Makefile->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS") &&
    this->GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS");
#if !defined(CMAKE_BOOTSTRAP)
  info.DefFileGenerated =
    info.WindowsExportAllSymbols || info.Sources.size() > 1;
#else
  // Our __create_def helper is not available during CMake bootstrap.
  info.DefFileGenerated = false;
#endif
  if (info.DefFileGenerated) {
    info.DefFile =
      this->GetObjectDirectory(config) /* has slash */ + "exports.def";
  } else if (!info.Sources.empty()) {
    info.DefFile = info.Sources.front()->GetFullPath();
  }
}